

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void lowerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint n;
  void *pvVar1;
  char *z;
  ulong uVar2;
  
  pvVar1 = sqlite3ValueText(*argv,'\x01');
  n = sqlite3ValueBytes(*argv,'\x01');
  if (pvVar1 != (void *)0x0) {
    z = (char *)contextMalloc(context,(long)(int)n + 1);
    if (z != (char *)0x0) {
      if (0 < (int)n) {
        uVar2 = 0;
        do {
          z[uVar2] = ""[*(byte *)((long)pvVar1 + uVar2)];
          uVar2 = uVar2 + 1;
        } while (n != uVar2);
      }
      setResultStrOrError(context,z,n,'\x01',sqlite3_free);
      return;
    }
  }
  return;
}

Assistant:

static void lowerFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  char *z1;
  const char *z2;
  int i, n;
  UNUSED_PARAMETER(argc);
  z2 = (char*)sqlite3_value_text(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  /* Verify that the call to _bytes() does not invalidate the _text() pointer */
  assert( z2==(char*)sqlite3_value_text(argv[0]) );
  if( z2 ){
    z1 = contextMalloc(context, ((i64)n)+1);
    if( z1 ){
      for(i=0; i<n; i++){
        z1[i] = sqlite3Tolower(z2[i]);
      }
      sqlite3_result_text(context, z1, n, sqlite3_free);
    }
  }
}